

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_allreduce(bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
             bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size)

{
  bsc_coll_params_t params;
  bsc_step_t bVar1;
  
  params.size = size;
  params.nmemb = nmemb;
  params.dst = dst;
  params.src = src;
  params.tmp = tmp_space;
  params.reducer = reducer;
  params.zero = zero;
  bVar1 = bsc_collective(depends,&bsc_allreduce_algs,0,group,params);
  return bVar1;
}

Assistant:

bsc_step_t bsc_allreduce( bsc_step_t depends, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size )
{
    bsc_coll_params_t p; memset(&p, 0, sizeof(p));
    p.src = src;
    p.dst = dst;
    p.tmp = tmp_space;
    p.reducer = reducer;
    p.zero = zero;
    p.nmemb = nmemb;
    p.size = size;
    return bsc_collective( depends, bsc_coll_allreduce, 0, group, p );
}